

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

int sat_solver3_push(sat_solver3 *s,int p)

{
  clause *pcVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int v;
  int iVar6;
  
  iVar6 = p >> 1;
  if (s->size <= iVar6) {
    __assert_fail("lit_var(p) < s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                  ,0x79d,"int sat_solver3_push(sat_solver3 *, int)");
  }
  iVar4 = s->qtail;
  uVar3 = (s->trail_lim).size;
  if (uVar3 == (s->trail_lim).cap) {
    iVar5 = (uVar3 >> 1) * 3;
    if ((int)uVar3 < 4) {
      iVar5 = uVar3 * 2;
    }
    piVar2 = (s->trail_lim).ptr;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar5 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)iVar5 << 2);
    }
    (s->trail_lim).ptr = piVar2;
    if (piVar2 == (int *)0x0) {
      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
             (double)(s->trail_lim).cap * 9.5367431640625e-07,(double)iVar5 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    (s->trail_lim).cap = iVar5;
    uVar3 = (s->trail_lim).size;
  }
  (s->trail_lim).size = uVar3 + 1;
  (s->trail_lim).ptr[(int)uVar3] = iVar4;
  s->root_level = s->root_level + 1;
  if (s->pFreqs[iVar6] == '\0') {
    s->pFreqs[iVar6] = '\x01';
  }
  uVar3 = (uint)s->assigns[iVar6];
  if (uVar3 == 3) {
    s->assigns[iVar6] = (byte)p & 1;
    s->levels[iVar6] = (s->trail_lim).size;
    s->reasons[iVar6] = 0;
    iVar6 = s->qtail;
    s->qtail = iVar6 + 1;
    s->trail[iVar6] = p;
  }
  else if ((p & 1U) != uVar3) {
    uVar3 = s->reasons[iVar6];
    if (uVar3 != 0) {
      if ((uVar3 & 1) != 0) {
        pcVar1 = s->binary;
        pcVar1[2] = (clause)(p ^ 1U);
        pcVar1[1] = (clause)((int)uVar3 >> 1);
        uVar3 = s->hBinary;
      }
      sat_solver3_analyze_final(s,uVar3,1);
      uVar3 = (s->conf_final).size;
      if (uVar3 == (s->conf_final).cap) {
        iVar6 = (uVar3 >> 1) * 3;
        if ((int)uVar3 < 4) {
          iVar6 = uVar3 * 2;
        }
        piVar2 = (s->conf_final).ptr;
        if (piVar2 == (int *)0x0) {
          piVar2 = (int *)malloc((long)iVar6 << 2);
        }
        else {
          piVar2 = (int *)realloc(piVar2,(long)iVar6 << 2);
        }
        (s->conf_final).ptr = piVar2;
        if (piVar2 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->conf_final).cap * 9.5367431640625e-07,
                 (double)iVar6 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->conf_final).cap = iVar6;
        uVar3 = (s->conf_final).size;
      }
      (s->conf_final).size = uVar3 + 1;
      *(uint *)((s->conf_final).ptr + (int)uVar3) = p ^ 1U;
      return 0;
    }
    if ((s->conf_final).size < 0) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->conf_final).size = 0;
    iVar4 = 0;
    if ((s->conf_final).cap == 0) {
      piVar2 = (s->conf_final).ptr;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc(0);
      }
      else {
        piVar2 = (int *)realloc(piVar2,0);
      }
      (s->conf_final).ptr = piVar2;
      if (piVar2 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->conf_final).cap * 9.5367431640625e-07,0);
        fflush(_stdout);
      }
      (s->conf_final).cap = 0;
      iVar4 = (s->conf_final).size;
    }
    piVar2 = (s->conf_final).ptr;
    (s->conf_final).size = iVar4 + 1;
    piVar2[iVar4] = p ^ 1;
    if (s->levels[iVar6] < 1) {
      return 0;
    }
    uVar3 = (s->conf_final).size;
    if (uVar3 == (s->conf_final).cap) {
      iVar6 = (uVar3 >> 1) * 3;
      if ((int)uVar3 < 4) {
        iVar6 = uVar3 * 2;
      }
      piVar2 = (int *)realloc(piVar2,(long)iVar6 << 2);
      (s->conf_final).ptr = piVar2;
      if (piVar2 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->conf_final).cap * 9.5367431640625e-07,(double)iVar6 * 9.5367431640625e-07
              );
        fflush(_stdout);
      }
      (s->conf_final).cap = iVar6;
      uVar3 = (s->conf_final).size;
    }
    (s->conf_final).size = uVar3 + 1;
    piVar2[(int)uVar3] = p;
    return 0;
  }
  iVar6 = sat_solver3_propagate(s);
  if (iVar6 != 0) {
    sat_solver3_analyze_final(s,iVar6,0);
  }
  return (uint)(iVar6 == 0);
}

Assistant:

int sat_solver3_push(sat_solver3* s, int p)
{
    assert(lit_var(p) < s->size);
    veci_push(&s->trail_lim,s->qtail);
    s->root_level++;
    if (!sat_solver3_enqueue(s,p,0))
    {
        int h = s->reasons[lit_var(p)];
        if (h)
        {
            if (clause_is_lit(h))
            {
                (clause_begin(s->binary))[1] = lit_neg(p);
                (clause_begin(s->binary))[0] = clause_read_lit(h);
                h = s->hBinary;
            }
            sat_solver3_analyze_final(s, h, 1);
            veci_push(&s->conf_final, lit_neg(p));
        }
        else
        {
            veci_resize(&s->conf_final,0);
            veci_push(&s->conf_final, lit_neg(p));
            // the two lines below are a bug fix by Siert Wieringa 
            if (var_level(s, lit_var(p)) > 0)
                veci_push(&s->conf_final, p);
        }
        //sat_solver3_canceluntil(s, 0);
        return false; 
    }
    else
    {
        int fConfl = sat_solver3_propagate(s);
        if (fConfl){
            sat_solver3_analyze_final(s, fConfl, 0);
            //assert(s->conf_final.size > 0);
            //sat_solver3_canceluntil(s, 0);
            return false; }
    }
    return true;
}